

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBMQVStep4(octet *out,octet *in,bake_cert *certa,void *state)

{
  bool_t bVar1;
  uint uVar2;
  err_t eVar3;
  int iVar4;
  word wVar5;
  ec_o *in_RCX;
  word *in_RDX;
  word *in_RSI;
  void *in_RDI;
  void *stack;
  octet *block1;
  octet *block0;
  octet *K;
  word *sb;
  word *t;
  word *Va;
  word *Qa;
  size_t no;
  size_t n;
  bake_bmqv_o *s;
  err_t code;
  void *in_stack_ffffffffffffff78;
  size_t *level;
  size_t *dest;
  ec_o *mod;
  ec_o *ec;
  size_t *a;
  ec_o *ec_00;
  size_t *b;
  ec_o *a_00;
  word *a_01;
  word *c;
  undefined4 in_stack_ffffffffffffffd0;
  ec_o *ec_01;
  
  ec_01 = in_RCX;
  bVar1 = objIsOperable(in_stack_ffffffffffffff78);
  if (bVar1 == 0) {
    return 0x6d;
  }
  c = (word *)in_RCX->f->mod[6];
  a_01 = (word *)in_RCX->f->mod[7];
  uVar2 = 0;
  if (*(int *)&in_RCX[2].B != 0) {
    uVar2 = 8;
  }
  bVar1 = memIsValid(in_RSI,(long)a_01 * 2 + (ulong)uVar2);
  if (bVar1 != 0) {
    uVar2 = 0;
    if (*(int *)((long)&in_RCX[2].B + 4) != 0) {
      uVar2 = 8;
    }
    bVar1 = memIsValid(in_RDI,(ulong)uVar2);
    if ((((bVar1 != 0) && (bVar1 = memIsValid(in_RDX,0x18), bVar1 != 0)) &&
        (bVar1 = memIsValid((void *)*in_RDX,in_RDX[1]), bVar1 != 0)) && (in_RDX[2] != 0)) {
      ec = (ec_o *)((long)&(in_RCX->hdr).keep + (in_RCX->hdr).keep);
      b = &(ec->hdr).keep + (long)c * 2;
      mod = (ec_o *)(b + (long)c * 2);
      a = &(mod->hdr).p_count + ((ulong)c >> 1);
      level = a + (long)c + ((ulong)c >> 1) + 1;
      dest = &(mod->hdr).o_count;
      ec_00 = mod;
      a_00 = ec;
      eVar3 = (*(code *)in_RDX[2])(ec,&in_RCX->order,*in_RDX,in_RDX[1]);
      if (eVar3 != 0) {
        return eVar3;
      }
      iVar4 = (*(code *)in_RCX->f->mod[8])(a_00,a_00,in_RCX->f->mod,level);
      if (((iVar4 != 0) &&
          (iVar4 = (*(code *)in_RCX->f->mod[8])
                             (&(a_00->hdr).keep + (long)c,(long)&(a_00->hdr).keep + (long)a_01,
                              in_RCX->f->mod,level), iVar4 != 0)) &&
         (bVar1 = ecpIsOnA(a,ec,mod), bVar1 != 0)) {
        iVar4 = (*(code *)in_RCX->f->mod[8])(b,in_RSI,in_RCX->f->mod,level);
        if (((iVar4 != 0) &&
            (iVar4 = (*(code *)in_RCX->f->mod[8])
                               (b + (long)c,(long)in_RSI + (long)a_01,in_RCX->f->mod,level),
            iVar4 != 0)) && (bVar1 = ecpIsOnA(a,ec,mod), bVar1 != 0)) {
          beltHashStart(dest);
          beltHashStepH(ec,(size_t)mod,dest);
          beltHashStepH(ec,(size_t)mod,dest);
          beltHashStepG2((octet *)ec,(size_t)mod,dest);
          u64From(dest,level,0x11cbf0);
          zzMul(c,a_01,(size_t)a_00,b,(size_t)ec_00,a);
          wVar5 = zzAdd2(a + ((ulong)c >> 1),in_RCX->A,(size_t)c);
          a[(long)c + ((ulong)c >> 1)] = wVar5;
          zzMod(in_RDX,(word *)ec_01,CONCAT44(eVar3,in_stack_ffffffffffffffd0),(word *)in_RCX,
                (size_t)c,a_01);
          zzSubMod((word *)ec_00,a,(word *)ec,(word *)mod,(size_t)dest);
          (&(ec_00->hdr).keep)[(ulong)c >> 1] = 1;
          bVar1 = ecMulA(in_RSI,in_RDX,ec_01,(word *)CONCAT44(eVar3,in_stack_ffffffffffffffd0),
                         (size_t)in_RCX,c);
          if (bVar1 == 0) {
            return 0x1f6;
          }
          bVar1 = ecpSubAA(a_01,(word *)a_00,b,ec_00,a);
          if (bVar1 == 0) {
            (*(code *)in_RCX->f->mod[9])(ec,in_RCX->f->n,in_RCX->f->mod,level);
          }
          else {
            bVar1 = ecMulA(in_RSI,in_RDX,ec_01,(word *)CONCAT44(eVar3,in_stack_ffffffffffffffd0),
                           (size_t)in_RCX,c);
            if (bVar1 == 0) {
              return 0x1f6;
            }
            (*(code *)in_RCX->f->mod[9])(ec,b,in_RCX->f->mod,level);
          }
          beltHashStart(dest);
          beltHashStepH(ec,(size_t)mod,dest);
          beltHashStepH(ec,(size_t)mod,dest);
          beltHashStepH(ec,(size_t)mod,dest);
          if (in_RCX[2].base != (word *)0x0) {
            beltHashStepH(ec,(size_t)mod,dest);
          }
          if (in_RCX[2].params != (void *)0x0) {
            beltHashStepH(ec,(size_t)mod,dest);
          }
          beltHashStepG((octet *)dest,level);
          memSet(dest,(octet)((ulong)level >> 0x38),0x11ceb3);
          memSet(dest,(octet)((ulong)level >> 0x38),0x11cec7);
          beltKRPStart(ec,(octet *)mod,(size_t)dest,(octet *)level);
          beltKRPStepG((octet *)ec_00,(size_t)a,(octet *)ec,mod);
          if ((*(int *)&in_RCX[2].B != 0) || (*(int *)((long)&in_RCX[2].B + 4) != 0)) {
            *(undefined1 *)&(mod->hdr).keep = 1;
            beltKRPStepG((octet *)ec_00,(size_t)a,(octet *)ec,mod);
          }
          if (*(int *)&in_RCX[2].B != 0) {
            *(undefined1 *)&(mod->hdr).keep = 0;
            beltMACStart(ec,(octet *)mod,(size_t)dest);
            beltMACStepA(ec,(size_t)mod,dest);
            bVar1 = beltMACStepV((octet *)dest,level);
            if (bVar1 == 0) {
              return 0x209;
            }
          }
          if (*(int *)((long)&in_RCX[2].B + 4) != 0) {
            beltMACStart(ec,(octet *)mod,(size_t)dest);
            beltMACStepA(ec,(size_t)mod,dest);
            beltMACStepG((octet *)dest,level);
          }
          return 0;
        }
        return 0x191;
      }
      return 0x202;
    }
  }
  return 0x6d;
}

Assistant:

err_t bakeBMQVStep4(octet out[], const octet in[], const bake_cert* certa,
	void* state)
{
	err_t code;
	bake_bmqv_o* s = (bake_bmqv_o*)state;
	size_t n, no;
	// стек
	word* Qa;			/* [2 * n] */
	word* Va;			/* [2 * n] */
	word* t;			/* [n / 2 + 1] */
	word* sb;			/* [n + n / 2 + 1] */
	octet* K;			/* [no] (совпадает с Qa) */
	octet* block0;		/* [16] (совпадает с t) */
	octet* block1;		/* [16] (следует за block0) */
	void* stack;
	// проверить входные данные
	if (!objIsOperable(s))
		return ERR_BAD_INPUT;
	n = s->ec->f->n, no = s->ec->f->no;
	if (!memIsValid(in, 2 * no + (s->settings->kca ? 8u : 0)) ||
		!memIsValid(out, s->settings->kcb ? 8u : 0) ||
		!memIsValid(certa, sizeof(bake_cert)) ||
		!memIsValid(certa->data, certa->len) ||
		certa->val == 0)
		return ERR_BAD_INPUT;
	ASSERT(memIsDisjoint2(out, s->settings->kcb ? 8u : 0, s, objKeep(s)));
	// раскладка стека
	Qa = objEnd(s, word);
	Va = Qa + 2 * n;
	t = Va + 2 * n;
	sb = t + n / 2 + 1;
	stack = sb + n + n / 2 + 1;
	K = (octet*)Qa;
	block0 = (octet*)t;
	block1 = block0 + 16;
	ASSERT(block1 + 16 <= (octet*)stack);
	// проверить certa
	code = certa->val((octet*)Qa, s->params, certa->data, certa->len);
	ERR_CALL_CHECK(code);
	if (!qrFrom(ecX(Qa), (octet*)Qa, s->ec->f, stack) ||
		!qrFrom(ecY(Qa, n), (octet*)Qa + no, s->ec->f, stack) ||
		!ecpIsOnA(Qa, s->ec, stack))
		return ERR_BAD_CERT;
	// Va <- in, Va \in E*?
	if (!qrFrom(ecX(Va), in, s->ec->f, stack) ||
		!qrFrom(ecY(Va, n), in + no, s->ec->f, stack) ||
		!ecpIsOnA(Va, s->ec, stack))
		return ERR_BAD_POINT;
	// t <- <beltHash(<Va>_2l || <Vb>_2l)>_l
	beltHashStart(stack);
	beltHashStepH(in, no, stack);
	beltHashStepH(s->Vb, no, stack);
	beltHashStepG2((octet*)t, no / 2, stack);
	wwFrom(t, t, no / 2);
	// sb <- (ub - (2^l + t)db) \mod q
	zzMul(sb, t, n / 2, s->d, n, stack);
	sb[n + n / 2] = zzAdd2(sb + n / 2, s->d, n);
	zzMod(sb, sb, n + n / 2 + 1, s->ec->order, n, stack);
	zzSubMod(sb, s->u, sb, s->ec->order, n);
	// K <- sb(Va - (2^l + t)Qa), K == O => K <- G
	t[n / 2] = 1;
	if (!ecMulA(Qa, Qa, s->ec, t, n / 2 + 1, stack))
		return ERR_BAD_PARAMS;
	if (!ecpSubAA(Va, Va, Qa, s->ec, stack))
		qrTo(K, s->ec->base, s->ec->f, stack);
	else
	{
		if (!ecMulA(Va, Va, s->ec, sb, n, stack))
			return ERR_BAD_PARAMS;
		qrTo(K, ecX(Va), s->ec->f, stack);
	}
	// K <- beltHash(<K>_2l || certa || certb || helloa || hellob)
	beltHashStart(stack);
	beltHashStepH(K, no, stack);
	beltHashStepH(certa->data, certa->len, stack);
	beltHashStepH(s->cert->data, s->cert->len, stack);
	if (s->settings->helloa)
		beltHashStepH(s->settings->helloa, s->settings->helloa_len, stack);
	if (s->settings->hellob)
		beltHashStepH(s->settings->hellob, s->settings->hellob_len, stack);
	beltHashStepG(K, stack);
	// K0 <- beltKRP(K, 1^96, 0)
	memSetZero(block0, 16);
	memSet(block1, 0xFF, 16);
	beltKRPStart(stack, K, 32, block1);
	beltKRPStepG(s->K0, 32, block0, stack);
	// K1 <- beltKRP(K, 1^96, 1)
	if (s->settings->kca || s->settings->kcb)
	{
		block0[0] = 1;
		beltKRPStepG(s->K1, 32, block0, stack);
	}
	// Ta == beltMAC(0^128, K1)?
	if (s->settings->kca)
	{
		block0[0] = 0;
		beltMACStart(stack, s->K1, 32);
		beltMACStepA(block0, 16, stack);
		if (!beltMACStepV(in + 2 * no, stack))
			return ERR_AUTH;
	}
	// Tb <- beltMAC(1^128, K1)?
	if (s->settings->kcb)
	{
		beltMACStart(stack, s->K1, 32);
		beltMACStepA(block1, 16, stack);
		beltMACStepG(out, stack);
	}
	// все нормально
	return ERR_OK;
}